

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collider.cxx
# Opt level: O0

void __thiscall glauber::Collider::run_events(Collider *this)

{
  type nucleusA;
  Event *in_RDI;
  Event *args_2;
  Output *unaff_retaddr;
  double b;
  int n;
  NucleonProfile *in_stack_ffffffffffffffc8;
  Nucleus *nucleusB;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  Event *args;
  
  args = in_RDI;
  for (iVar1 = 0;
      iVar1 < (int)(in_RDI->TB_).super_multi_array_ref<double,_2UL>.
                   super_const_multi_array_ref<double,_2UL,_double_*>.extent_list_.elems[0];
      iVar1 = iVar1 + 1) {
    args_2 = (Event *)sample_impact_param(this);
    nucleusB = (Nucleus *)
               &(in_RDI->TB_).super_multi_array_ref<double,_2UL>.
                super_const_multi_array_ref<double,_2UL,_double_*>.index_base_list_;
    nucleusA = std::unique_ptr<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_>::operator*
                         ((unique_ptr<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_> *)
                          nucleusB);
    std::unique_ptr<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_>::operator*
              ((unique_ptr<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_> *)nucleusB);
    Event::compute(in_RDI,nucleusA,nucleusB,in_stack_ffffffffffffffc8);
    Output::operator()(unaff_retaddr,(int *)args,(double *)CONCAT44(iVar1,in_stack_fffffffffffffff0)
                       ,args_2);
  }
  return;
}

Assistant:

void Collider::run_events() {
  // The main event loop.
  for (int n = 0; n < nevents_; ++n) {
    // Sampling the impact parameter also implicitly prepares the nuclei for
    // event computation, i.e. by sampling nucleon positions and participants.
    double b = sample_impact_param();

    // Pass the prepared nuclei to the Event.  It computes the entropy profile
    // (thickness grid) and other event observables.
    event_.compute(*nucleusA_, *nucleusB_, nucleon_profile_);

    // Write event data.
    output_(n, b, event_);
  }
}